

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O2

ConcreteType * __thiscall
soul::PoolAllocator::allocate<soul::AST::ConcreteType,soul::AST::Context&,soul::Type&>
          (PoolAllocator *this,Context *args,Type *args_1)

{
  PoolItem *pPVar1;
  Type local_40;
  
  pPVar1 = allocateSpaceForObject(this,0x48);
  Type::Type(&local_40,args_1);
  AST::ConcreteType::ConcreteType((ConcreteType *)&pPVar1->item,args,&local_40);
  RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_40.structure);
  pPVar1->destructor =
       allocate<soul::AST::ConcreteType,_soul::AST::Context_&,_soul::Type_&>::
       anon_class_1_0_00000001::__invoke;
  return (ConcreteType *)&pPVar1->item;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }